

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall amrex::StateData::~StateData(StateData *this)

{
  BoxArray *in_RDI;
  
  *(undefined8 *)((long)&(in_RDI->m_bat).m_op + 4) = 0;
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)in_RDI);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)in_RDI);
  DistributionMapping::~DistributionMapping((DistributionMapping *)0x13b3cb9);
  BoxArray::~BoxArray(in_RDI);
  std::
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ::~unique_ptr((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 *)in_RDI);
  return;
}

Assistant:

StateData::~StateData()
{
    desc = nullptr;
}